

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O0

SimpleString StringFrom(void *value)

{
  size_t extraout_RDX;
  SimpleString SVar1;
  SimpleString local_38;
  SimpleString local_28;
  void *value_local;
  
  value_local = value;
  SimpleString::SimpleString(&local_28,"0x");
  HexStringFrom(&local_38);
  SimpleString::operator+((SimpleString *)value,&local_28);
  SimpleString::~SimpleString(&local_38);
  SimpleString::~SimpleString(&local_28);
  SVar1.bufferSize_ = extraout_RDX;
  SVar1.buffer_ = (char *)value;
  return SVar1;
}

Assistant:

SimpleString StringFrom(const void* value)
{
    return SimpleString("0x") + HexStringFrom(value);
}